

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O2

btMatrixX<float> * __thiscall
btMatrixX<float>::transpose(btMatrixX<float> *__return_storage_ptr__,btMatrixX<float> *this)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  float *pfVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  float *pfVar10;
  ulong uVar11;
  
  btMatrixX(__return_storage_ptr__,this->m_cols,this->m_rows);
  setZero(__return_storage_ptr__);
  uVar2 = this->m_cols;
  uVar6 = 0;
  uVar5 = (ulong)(uint)this->m_rows;
  if (this->m_rows < 1) {
    uVar5 = uVar6;
  }
  uVar7 = 0;
  if (0 < (int)uVar2) {
    uVar7 = (ulong)uVar2;
  }
  iVar8 = __return_storage_ptr__->m_setElemOperations;
  for (uVar9 = 0; uVar9 != uVar7; uVar9 = uVar9 + 1) {
    iVar3 = __return_storage_ptr__->m_cols;
    pfVar4 = (__return_storage_ptr__->m_storage).m_data;
    pfVar10 = (float *)((long)(this->m_storage).m_data + uVar6);
    for (uVar11 = 0; uVar5 != uVar11; uVar11 = uVar11 + 1) {
      fVar1 = *pfVar10;
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        iVar8 = iVar8 + 1;
        __return_storage_ptr__->m_setElemOperations = iVar8;
        *(float *)((long)pfVar4 + uVar11 * 4 + (long)iVar3 * uVar6) = fVar1;
      }
      pfVar10 = pfVar10 + (int)uVar2;
    }
    uVar6 = uVar6 + 4;
  }
  return __return_storage_ptr__;
}

Assistant:

btMatrixX transpose() const
	{
		//transpose is optimized for sparse matrices
		btMatrixX tr(m_cols,m_rows);
		tr.setZero();
		for (int i=0;i<m_cols;i++)
			for (int j=0;j<m_rows;j++)
			{
				T v = (*this)(j,i);
				if (v)
				{
					tr.setElem(i,j,v);
				}
			}
		return tr;
	}